

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Agent.cpp
# Opt level: O1

void __thiscall
jaegertracing::agent::thrift::AgentProcessor::process_emitZipkinBatch
          (AgentProcessor *this,int32_t param_1,TProtocol *iprot,TProtocol *param_3,
          void *callContext)

{
  element_type *peVar1;
  element_type *peVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  element_type *peVar3;
  element_type *peVar4;
  int iVar5;
  TProtocol *extraout_RDX;
  TProtocol *__buf;
  undefined8 uVar6;
  undefined1 auVar7 [16];
  TProcessorContextFreer freer;
  Agent_emitZipkinBatch_args args;
  Agent_emitZipkinBatch_args local_50;
  
  peVar1 = (this->super_TDispatchProcessor).super_TProcessor.eventHandler_.
           super___shared_ptr<apache::thrift::TProcessorEventHandler,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  if (peVar1 == (element_type *)0x0) {
    uVar6 = 0;
    __buf = iprot;
  }
  else {
    auVar7 = (**(code **)(*(long *)peVar1 + 0x10))(peVar1,"Agent.emitZipkinBatch",callContext);
    uVar6 = auVar7._0_8_;
    __buf = auVar7._8_8_;
  }
  peVar1 = (this->super_TDispatchProcessor).super_TProcessor.eventHandler_.
           super___shared_ptr<apache::thrift::TProcessorEventHandler,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  if (peVar1 != (element_type *)0x0) {
    (**(code **)(*(long *)peVar1 + 0x20))(peVar1,uVar6,"Agent.emitZipkinBatch");
    __buf = extraout_RDX;
  }
  local_50._vptr_Agent_emitZipkinBatch_args =
       (_func_int **)&PTR__Agent_emitZipkinBatch_args_00276398;
  local_50.spans.
  super__Vector_base<twitter::zipkin::thrift::Span,_std::allocator<twitter::zipkin::thrift::Span>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_50.spans.
  super__Vector_base<twitter::zipkin::thrift::Span,_std::allocator<twitter::zipkin::thrift::Span>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_50.spans.
  super__Vector_base<twitter::zipkin::thrift::Span,_std::allocator<twitter::zipkin::thrift::Span>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_50.__isset = (_Agent_emitZipkinBatch_args__isset)((byte)local_50.__isset & 0xfe);
  Agent_emitZipkinBatch_args::read(&local_50,(int)iprot,__buf,(size_t)param_3);
  (*iprot->_vptr_TProtocol[0x18])(iprot);
  peVar2 = (iprot->ptrans_).
           super___shared_ptr<apache::thrift::transport::TTransport,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  this_00 = (iprot->ptrans_).
            super___shared_ptr<apache::thrift::transport::TTransport,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi;
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      this_00->_M_use_count = this_00->_M_use_count + 1;
      UNLOCK();
    }
    else {
      this_00->_M_use_count = this_00->_M_use_count + 1;
    }
  }
  iVar5 = (*peVar2->_vptr_TTransport[8])();
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
  }
  peVar3 = (this->super_TDispatchProcessor).super_TProcessor.eventHandler_.
           super___shared_ptr<apache::thrift::TProcessorEventHandler,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  if (peVar3 != (element_type *)0x0) {
    (**(code **)(*(long *)peVar3 + 0x28))(peVar3,uVar6,"Agent.emitZipkinBatch",iVar5);
  }
  peVar4 = (this->iface_).
           super___shared_ptr<jaegertracing::agent::thrift::AgentIf,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  (**(code **)(*(long *)peVar4 + 0x10))(peVar4,&local_50.spans);
  peVar3 = (this->super_TDispatchProcessor).super_TProcessor.eventHandler_.
           super___shared_ptr<apache::thrift::TProcessorEventHandler,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  if (peVar3 != (element_type *)0x0) {
    (**(code **)(*(long *)peVar3 + 0x40))(peVar3,uVar6,"Agent.emitZipkinBatch");
  }
  Agent_emitZipkinBatch_args::~Agent_emitZipkinBatch_args(&local_50);
  if (peVar1 != (element_type *)0x0) {
    (**(code **)(*(long *)peVar1 + 0x18))(peVar1,uVar6,"Agent.emitZipkinBatch");
  }
  return;
}

Assistant:

void AgentProcessor::process_emitZipkinBatch(int32_t, ::apache::thrift::protocol::TProtocol* iprot, ::apache::thrift::protocol::TProtocol*, void* callContext)
{
  void* ctx = NULL;
  if (this->eventHandler_.get() != NULL) {
    ctx = this->eventHandler_->getContext("Agent.emitZipkinBatch", callContext);
  }
  ::apache::thrift::TProcessorContextFreer freer(this->eventHandler_.get(), ctx, "Agent.emitZipkinBatch");

  if (this->eventHandler_.get() != NULL) {
    this->eventHandler_->preRead(ctx, "Agent.emitZipkinBatch");
  }

  Agent_emitZipkinBatch_args args;
  args.read(iprot);
  iprot->readMessageEnd();
  uint32_t bytes = iprot->getTransport()->readEnd();

  if (this->eventHandler_.get() != NULL) {
    this->eventHandler_->postRead(ctx, "Agent.emitZipkinBatch", bytes);
  }

  try {
    iface_->emitZipkinBatch(args.spans);
  } catch (const std::exception&) {
    if (this->eventHandler_.get() != NULL) {
      this->eventHandler_->handlerError(ctx, "Agent.emitZipkinBatch");
    }
    return;
  }

  if (this->eventHandler_.get() != NULL) {
    this->eventHandler_->asyncComplete(ctx, "Agent.emitZipkinBatch");
  }

  return;
}